

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midi_timidity.cpp
# Opt level: O0

bool TimidityPPMIDIDevice::FillStream(SoundStream *stream,void *buff,int len,void *userdata)

{
  long lVar1;
  ssize_t sVar2;
  fd_set *__arr;
  undefined1 auStack_d0 [4];
  uint __i;
  timeval tv;
  fd_set rfds;
  ssize_t got;
  TimidityPPMIDIDevice *song;
  void *userdata_local;
  int len_local;
  void *buff_local;
  SoundStream *stream_local;
  
  if (ChildQuit == *(int *)((long)userdata + 0x28)) {
    ChildQuit = 0;
    fprintf(_stderr,"child gone\n");
    *(undefined4 *)((long)userdata + 0x28) = 0xffffffff;
    stream_local._7_1_ = false;
  }
  else {
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      rfds.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
    }
    lVar1 = (long)(*(int *)((long)userdata + 0x20) / 0x40);
    rfds.fds_bits[lVar1 + -1] =
         1L << ((byte)((long)*(int *)((long)userdata + 0x20) % 0x40) & 0x3f) |
         rfds.fds_bits[lVar1 + -1];
    _auStack_d0 = 0;
    tv.tv_sec = 0x32;
    select(1,(fd_set *)&tv.tv_usec,(fd_set *)0x0,(fd_set *)0x0,(timeval *)auStack_d0);
    sVar2 = ::read(*(int *)((long)userdata + 0x20),buff,(long)len);
    if (sVar2 < len) {
      memset((void *)((long)buff + sVar2),0,len - sVar2);
    }
    stream_local._7_1_ = true;
  }
  return stream_local._7_1_;
}

Assistant:

bool TimidityPPMIDIDevice::FillStream(SoundStream *stream, void *buff, int len, void *userdata)
{
	TimidityPPMIDIDevice *song = (TimidityPPMIDIDevice *)userdata;
	
#ifdef _WIN32
	DWORD avail, got, didget;

	if (!PeekNamedPipe(song->ReadWavePipe, NULL, 0, NULL, &avail, NULL) || avail == 0)
	{ // If nothing is available from the pipe, play silence.
		memset (buff, 0, len);
	}
	else
	{
		didget = 0;
		for (;;)
		{
			ReadFile(song->ReadWavePipe, (BYTE *)buff+didget, len-didget, &got, NULL);
			didget += got;
			if (didget >= (DWORD)len)
				break;

			// Give TiMidity++ a chance to output something more to the pipe
			Sleep (10);
			if (!PeekNamedPipe(song->ReadWavePipe, NULL, 0, NULL, &avail, NULL) || avail == 0)
			{
				memset ((BYTE *)buff+didget, 0, len-didget);
				break;
			}
		} 
	}
#else
	ssize_t got;
	fd_set rfds;
	struct timeval tv;

	if (ChildQuit == song->ChildProcess)
	{
		ChildQuit = 0;
		fprintf(stderr, "child gone\n");
		song->ChildProcess = -1;
		return false;
	}

	FD_ZERO(&rfds);
	FD_SET(song->WavePipe[0], &rfds);
	tv.tv_sec = 0;
	tv.tv_usec = 50;
//	fprintf(stderr,"select\n");
	if (select(1, &rfds, NULL, NULL, &tv) <= 0 && 0)
	{ // Nothing available, so play silence.
//	fprintf(stderr,"nothing\n");
	 //   memset(buff, 0, len);
	    return true;
	}
//	fprintf(stderr,"something\n");

	got = read(song->WavePipe[0], (BYTE *)buff, len);
	if (got < len)
	{
		memset((BYTE *)buff+got, 0, len-got);
	}
#endif
	return true;
}